

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O1

void AArch64_post_printer(csh handle,cs_insn *flat_insn,char *insn_asm,MCInst *mci)

{
  uint uVar1;
  
  if ((*(int *)(handle + 0x60) == 3) && (mci->csh->detail != CS_OPT_OFF)) {
    uVar1 = MCInst_getOpcode(mci);
    switch(uVar1) {
    case 0x2dc:
    case 0x2de:
    case 0x2e0:
    case 0x2e2:
    case 0x2e4:
    case 0x2e6:
    case 0x2e8:
    case 0x2ea:
    case 0x2ec:
    case 0x2ee:
    case 0x2f0:
    case 0x2f2:
    case 0x2f4:
    case 0x2f6:
    case 0x2f8:
    case 0x2fa:
    case 0x2fc:
    case 0x2fe:
    case 0x300:
    case 0x302:
    case 0x304:
    case 0x306:
    case 0x308:
    case 0x30a:
    case 0x30c:
    case 0x30e:
    case 0x310:
    case 0x312:
    case 0x314:
    case 0x316:
    case 0x318:
    case 0x31a:
    case 0x31c:
    case 0x31e:
    case 800:
    case 0x322:
    case 0x324:
    case 0x326:
    case 0x328:
    case 0x32a:
    case 0x32c:
    case 0x32e:
    case 0x330:
    case 0x332:
    case 0x334:
    case 0x336:
    case 0x338:
    case 0x33a:
    case 0x33c:
    case 0x33e:
    case 0x340:
    case 0x342:
    case 0x344:
    case 0x346:
    case 0x348:
    case 0x34a:
    case 0x34c:
    case 0x34e:
    case 0x350:
    case 0x352:
    case 0x354:
    case 0x356:
    case 0x358:
    case 0x35a:
    case 0x35c:
    case 0x35e:
    case 0x360:
    case 0x362:
    case 0x364:
    case 0x366:
    case 0x368:
    case 0x36a:
    case 0x36c:
    case 0x36e:
    case 0x370:
    case 0x372:
    case 0x374:
    case 0x376:
    case 0x378:
    case 0x37a:
    case 0x37c:
    case 0x37e:
    case 0x380:
    case 0x382:
    case 900:
    case 0x386:
    case 0x388:
    case 0x38a:
    case 0x38c:
    case 0x38e:
    case 0x390:
    case 0x392:
    case 0x394:
    case 0x396:
    case 0x398:
    case 0x39a:
    case 0x39c:
    case 0x39e:
    case 0x3a0:
    case 0x3a2:
    case 0x3a4:
    case 0x3b5:
    case 0x3b6:
    case 0x3b8:
    case 0x3b9:
    case 0x3bb:
    case 0x3bc:
    case 0x3be:
    case 0x3bf:
    case 0x3c1:
    case 0x3c2:
    case 0x3c4:
    case 0x3c5:
    case 0x3c6:
    case 0x3c7:
    case 0x3cb:
    case 0x3cc:
    case 0x3d1:
    case 0x3d2:
    case 0x3d6:
    case 0x3d7:
    case 0x3db:
    case 0x3dc:
    case 0x3e1:
    case 0x3e2:
    case 0x3e6:
    case 999:
    case 0x3eb:
    case 0x3ec:
    case 0x3f0:
    case 0x3f1:
    case 0x3f5:
    case 0x3f6:
    case 0x3fb:
    case 0x3fc:
    case 0x401:
    case 0x402:
    case 0x407:
    case 0x408:
    case 0x40d:
    case 0x40e:
switchD_0020af2c_caseD_2dc:
      (flat_insn->detail->field_6).x86.opcode[1] = '\x01';
      break;
    case 0x2dd:
    case 0x2df:
    case 0x2e1:
    case 0x2e3:
    case 0x2e5:
    case 0x2e7:
    case 0x2e9:
    case 0x2eb:
    case 0x2ed:
    case 0x2ef:
    case 0x2f1:
    case 0x2f3:
    case 0x2f5:
    case 0x2f7:
    case 0x2f9:
    case 0x2fb:
    case 0x2fd:
    case 0x2ff:
    case 0x301:
    case 0x303:
    case 0x305:
    case 0x307:
    case 0x309:
    case 0x30b:
    case 0x30d:
    case 0x30f:
    case 0x311:
    case 0x313:
    case 0x315:
    case 0x317:
    case 0x319:
    case 0x31b:
    case 0x31d:
    case 799:
    case 0x321:
    case 0x323:
    case 0x325:
    case 0x327:
    case 0x329:
    case 0x32b:
    case 0x32d:
    case 0x32f:
    case 0x331:
    case 0x333:
    case 0x335:
    case 0x337:
    case 0x339:
    case 0x33b:
    case 0x33d:
    case 0x33f:
    case 0x341:
    case 0x343:
    case 0x345:
    case 0x347:
    case 0x349:
    case 0x34b:
    case 0x34d:
    case 0x34f:
    case 0x351:
    case 0x353:
    case 0x355:
    case 0x357:
    case 0x359:
    case 0x35b:
    case 0x35d:
    case 0x35f:
    case 0x361:
    case 0x363:
    case 0x365:
    case 0x367:
    case 0x369:
    case 0x36b:
    case 0x36d:
    case 0x36f:
    case 0x371:
    case 0x373:
    case 0x375:
    case 0x377:
    case 0x379:
    case 0x37b:
    case 0x37d:
    case 0x37f:
    case 0x381:
    case 899:
    case 0x385:
    case 0x387:
    case 0x389:
    case 0x38b:
    case 0x38d:
    case 0x38f:
    case 0x391:
    case 0x393:
    case 0x395:
    case 0x397:
    case 0x399:
    case 0x39b:
    case 0x39d:
    case 0x39f:
    case 0x3a1:
    case 0x3a3:
    case 0x3a5:
    case 0x3a6:
    case 0x3a7:
    case 0x3a8:
    case 0x3a9:
    case 0x3aa:
    case 0x3ab:
    case 0x3ac:
    case 0x3ad:
    case 0x3ae:
    case 0x3af:
    case 0x3b0:
    case 0x3b1:
    case 0x3b2:
    case 0x3b3:
    case 0x3b4:
    case 0x3b7:
    case 0x3ba:
    case 0x3bd:
    case 0x3c0:
    case 0x3c3:
    case 0x3c8:
    case 0x3c9:
    case 0x3ca:
    case 0x3cd:
    case 0x3ce:
    case 0x3cf:
    case 0x3d0:
    case 0x3d3:
    case 0x3d4:
    case 0x3d5:
    case 0x3d8:
    case 0x3d9:
    case 0x3da:
    case 0x3dd:
    case 0x3de:
    case 0x3df:
    case 0x3e0:
    case 0x3e3:
    case 0x3e4:
    case 0x3e5:
    case 1000:
    case 0x3e9:
    case 0x3ea:
    case 0x3ed:
    case 0x3ee:
    case 0x3ef:
    case 0x3f2:
    case 0x3f3:
    case 0x3f4:
    case 0x3f7:
    case 0x3f8:
    case 0x3f9:
    case 0x3fa:
    case 0x3fd:
    case 0x3fe:
    case 0x3ff:
    case 0x400:
    case 0x403:
    case 0x404:
    case 0x405:
    case 0x406:
    case 0x409:
    case 0x40a:
    case 0x40b:
    case 0x40c:
      break;
    default:
      switch(uVar1) {
      case 0x6b0:
      case 0x6b2:
      case 0x6b4:
      case 0x6b6:
      case 0x6b8:
      case 0x6ba:
      case 0x6bc:
      case 0x6be:
      case 0x6c0:
      case 0x6c2:
      case 0x6c4:
      case 0x6c6:
      case 0x6c8:
      case 0x6ca:
      case 0x6cc:
      case 0x6ce:
      case 0x6d0:
      case 0x6d2:
      case 0x6d4:
      case 0x6d6:
      case 0x6d8:
      case 0x6da:
      case 0x6dc:
      case 0x6de:
      case 0x6e0:
      case 0x6e2:
      case 0x6e4:
      case 0x6e6:
      case 0x6e8:
      case 0x6ea:
      case 0x6ec:
      case 0x6ee:
      case 0x6f0:
      case 0x6f2:
      case 0x6f4:
      case 0x6f6:
      case 0x6f8:
      case 0x6fa:
      case 0x6fc:
      case 0x6fe:
      case 0x700:
      case 0x702:
      case 0x704:
      case 0x706:
      case 0x708:
      case 0x70a:
      case 0x70c:
      case 0x70e:
      case 0x710:
      case 0x712:
      case 0x714:
      case 0x716:
      case 0x718:
      case 0x71a:
      case 0x71c:
      case 0x71e:
      case 0x720:
      case 0x722:
      case 0x724:
      case 0x726:
      case 0x728:
      case 0x72a:
      case 0x72c:
      case 0x72e:
      case 0x730:
      case 0x732:
      case 0x734:
      case 0x736:
      case 0x738:
      case 0x749:
      case 0x74a:
      case 0x74c:
      case 0x74d:
      case 0x74f:
      case 0x750:
      case 0x752:
      case 0x753:
      case 0x755:
      case 0x756:
      case 0x757:
      case 0x758:
      case 0x75c:
      case 0x75d:
      case 0x761:
      case 0x762:
      case 0x766:
      case 0x767:
      case 0x76b:
      case 0x76c:
      case 0x770:
      case 0x771:
      case 0x775:
      case 0x776:
      case 0x77a:
      case 0x77b:
      case 0x77f:
      case 0x780:
        goto switchD_0020af2c_caseD_2dc;
      default:
        break;
      }
    }
  }
  return;
}

Assistant:

void AArch64_post_printer(csh handle, cs_insn *flat_insn, char *insn_asm, MCInst *mci)
{
	if (((cs_struct *)handle)->detail != CS_OPT_ON)
		return;

	if (mci->csh->detail) {
		unsigned opcode = MCInst_getOpcode(mci);
		switch (opcode) {
			default:
				break;
			case AArch64_LD1Fourv16b_POST:
			case AArch64_LD1Fourv1d_POST:
			case AArch64_LD1Fourv2d_POST:
			case AArch64_LD1Fourv2s_POST:
			case AArch64_LD1Fourv4h_POST:
			case AArch64_LD1Fourv4s_POST:
			case AArch64_LD1Fourv8b_POST:
			case AArch64_LD1Fourv8h_POST:
			case AArch64_LD1Onev16b_POST:
			case AArch64_LD1Onev1d_POST:
			case AArch64_LD1Onev2d_POST:
			case AArch64_LD1Onev2s_POST:
			case AArch64_LD1Onev4h_POST:
			case AArch64_LD1Onev4s_POST:
			case AArch64_LD1Onev8b_POST:
			case AArch64_LD1Onev8h_POST:
			case AArch64_LD1Rv16b_POST:
			case AArch64_LD1Rv1d_POST:
			case AArch64_LD1Rv2d_POST:
			case AArch64_LD1Rv2s_POST:
			case AArch64_LD1Rv4h_POST:
			case AArch64_LD1Rv4s_POST:
			case AArch64_LD1Rv8b_POST:
			case AArch64_LD1Rv8h_POST:
			case AArch64_LD1Threev16b_POST:
			case AArch64_LD1Threev1d_POST:
			case AArch64_LD1Threev2d_POST:
			case AArch64_LD1Threev2s_POST:
			case AArch64_LD1Threev4h_POST:
			case AArch64_LD1Threev4s_POST:
			case AArch64_LD1Threev8b_POST:
			case AArch64_LD1Threev8h_POST:
			case AArch64_LD1Twov16b_POST:
			case AArch64_LD1Twov1d_POST:
			case AArch64_LD1Twov2d_POST:
			case AArch64_LD1Twov2s_POST:
			case AArch64_LD1Twov4h_POST:
			case AArch64_LD1Twov4s_POST:
			case AArch64_LD1Twov8b_POST:
			case AArch64_LD1Twov8h_POST:
			case AArch64_LD1i16_POST:
			case AArch64_LD1i32_POST:
			case AArch64_LD1i64_POST:
			case AArch64_LD1i8_POST:
			case AArch64_LD2Rv16b_POST:
			case AArch64_LD2Rv1d_POST:
			case AArch64_LD2Rv2d_POST:
			case AArch64_LD2Rv2s_POST:
			case AArch64_LD2Rv4h_POST:
			case AArch64_LD2Rv4s_POST:
			case AArch64_LD2Rv8b_POST:
			case AArch64_LD2Rv8h_POST:
			case AArch64_LD2Twov16b_POST:
			case AArch64_LD2Twov2d_POST:
			case AArch64_LD2Twov2s_POST:
			case AArch64_LD2Twov4h_POST:
			case AArch64_LD2Twov4s_POST:
			case AArch64_LD2Twov8b_POST:
			case AArch64_LD2Twov8h_POST:
			case AArch64_LD2i16_POST:
			case AArch64_LD2i32_POST:
			case AArch64_LD2i64_POST:
			case AArch64_LD2i8_POST:
			case AArch64_LD3Rv16b_POST:
			case AArch64_LD3Rv1d_POST:
			case AArch64_LD3Rv2d_POST:
			case AArch64_LD3Rv2s_POST:
			case AArch64_LD3Rv4h_POST:
			case AArch64_LD3Rv4s_POST:
			case AArch64_LD3Rv8b_POST:
			case AArch64_LD3Rv8h_POST:
			case AArch64_LD3Threev16b_POST:
			case AArch64_LD3Threev2d_POST:
			case AArch64_LD3Threev2s_POST:
			case AArch64_LD3Threev4h_POST:
			case AArch64_LD3Threev4s_POST:
			case AArch64_LD3Threev8b_POST:
			case AArch64_LD3Threev8h_POST:
			case AArch64_LD3i16_POST:
			case AArch64_LD3i32_POST:
			case AArch64_LD3i64_POST:
			case AArch64_LD3i8_POST:
			case AArch64_LD4Fourv16b_POST:
			case AArch64_LD4Fourv2d_POST:
			case AArch64_LD4Fourv2s_POST:
			case AArch64_LD4Fourv4h_POST:
			case AArch64_LD4Fourv4s_POST:
			case AArch64_LD4Fourv8b_POST:
			case AArch64_LD4Fourv8h_POST:
			case AArch64_LD4Rv16b_POST:
			case AArch64_LD4Rv1d_POST:
			case AArch64_LD4Rv2d_POST:
			case AArch64_LD4Rv2s_POST:
			case AArch64_LD4Rv4h_POST:
			case AArch64_LD4Rv4s_POST:
			case AArch64_LD4Rv8b_POST:
			case AArch64_LD4Rv8h_POST:
			case AArch64_LD4i16_POST:
			case AArch64_LD4i32_POST:
			case AArch64_LD4i64_POST:
			case AArch64_LD4i8_POST:
			case AArch64_LDPDpost:
			case AArch64_LDPDpre:
			case AArch64_LDPQpost:
			case AArch64_LDPQpre:
			case AArch64_LDPSWpost:
			case AArch64_LDPSWpre:
			case AArch64_LDPSpost:
			case AArch64_LDPSpre:
			case AArch64_LDPWpost:
			case AArch64_LDPWpre:
			case AArch64_LDPXpost:
			case AArch64_LDPXpre:
			case AArch64_LDRBBpost:
			case AArch64_LDRBBpre:
			case AArch64_LDRBpost:
			case AArch64_LDRBpre:
			case AArch64_LDRDpost:
			case AArch64_LDRDpre:
			case AArch64_LDRHHpost:
			case AArch64_LDRHHpre:
			case AArch64_LDRHpost:
			case AArch64_LDRHpre:
			case AArch64_LDRQpost:
			case AArch64_LDRQpre:
			case AArch64_LDRSBWpost:
			case AArch64_LDRSBWpre:
			case AArch64_LDRSBXpost:
			case AArch64_LDRSBXpre:
			case AArch64_LDRSHWpost:
			case AArch64_LDRSHWpre:
			case AArch64_LDRSHXpost:
			case AArch64_LDRSHXpre:
			case AArch64_LDRSWpost:
			case AArch64_LDRSWpre:
			case AArch64_LDRSpost:
			case AArch64_LDRSpre:
			case AArch64_LDRWpost:
			case AArch64_LDRWpre:
			case AArch64_LDRXpost:
			case AArch64_LDRXpre:
			case AArch64_ST1Fourv16b_POST:
			case AArch64_ST1Fourv1d_POST:
			case AArch64_ST1Fourv2d_POST:
			case AArch64_ST1Fourv2s_POST:
			case AArch64_ST1Fourv4h_POST:
			case AArch64_ST1Fourv4s_POST:
			case AArch64_ST1Fourv8b_POST:
			case AArch64_ST1Fourv8h_POST:
			case AArch64_ST1Onev16b_POST:
			case AArch64_ST1Onev1d_POST:
			case AArch64_ST1Onev2d_POST:
			case AArch64_ST1Onev2s_POST:
			case AArch64_ST1Onev4h_POST:
			case AArch64_ST1Onev4s_POST:
			case AArch64_ST1Onev8b_POST:
			case AArch64_ST1Onev8h_POST:
			case AArch64_ST1Threev16b_POST:
			case AArch64_ST1Threev1d_POST:
			case AArch64_ST1Threev2d_POST:
			case AArch64_ST1Threev2s_POST:
			case AArch64_ST1Threev4h_POST:
			case AArch64_ST1Threev4s_POST:
			case AArch64_ST1Threev8b_POST:
			case AArch64_ST1Threev8h_POST:
			case AArch64_ST1Twov16b_POST:
			case AArch64_ST1Twov1d_POST:
			case AArch64_ST1Twov2d_POST:
			case AArch64_ST1Twov2s_POST:
			case AArch64_ST1Twov4h_POST:
			case AArch64_ST1Twov4s_POST:
			case AArch64_ST1Twov8b_POST:
			case AArch64_ST1Twov8h_POST:
			case AArch64_ST1i16_POST:
			case AArch64_ST1i32_POST:
			case AArch64_ST1i64_POST:
			case AArch64_ST1i8_POST:
			case AArch64_ST2Twov16b_POST:
			case AArch64_ST2Twov2d_POST:
			case AArch64_ST2Twov2s_POST:
			case AArch64_ST2Twov4h_POST:
			case AArch64_ST2Twov4s_POST:
			case AArch64_ST2Twov8b_POST:
			case AArch64_ST2Twov8h_POST:
			case AArch64_ST2i16_POST:
			case AArch64_ST2i32_POST:
			case AArch64_ST2i64_POST:
			case AArch64_ST2i8_POST:
			case AArch64_ST3Threev16b_POST:
			case AArch64_ST3Threev2d_POST:
			case AArch64_ST3Threev2s_POST:
			case AArch64_ST3Threev4h_POST:
			case AArch64_ST3Threev4s_POST:
			case AArch64_ST3Threev8b_POST:
			case AArch64_ST3Threev8h_POST:
			case AArch64_ST3i16_POST:
			case AArch64_ST3i32_POST:
			case AArch64_ST3i64_POST:
			case AArch64_ST3i8_POST:
			case AArch64_ST4Fourv16b_POST:
			case AArch64_ST4Fourv2d_POST:
			case AArch64_ST4Fourv2s_POST:
			case AArch64_ST4Fourv4h_POST:
			case AArch64_ST4Fourv4s_POST:
			case AArch64_ST4Fourv8b_POST:
			case AArch64_ST4Fourv8h_POST:
			case AArch64_ST4i16_POST:
			case AArch64_ST4i32_POST:
			case AArch64_ST4i64_POST:
			case AArch64_ST4i8_POST:
			case AArch64_STPDpost:
			case AArch64_STPDpre:
			case AArch64_STPQpost:
			case AArch64_STPQpre:
			case AArch64_STPSpost:
			case AArch64_STPSpre:
			case AArch64_STPWpost:
			case AArch64_STPWpre:
			case AArch64_STPXpost:
			case AArch64_STPXpre:
			case AArch64_STRBBpost:
			case AArch64_STRBBpre:
			case AArch64_STRBpost:
			case AArch64_STRBpre:
			case AArch64_STRDpost:
			case AArch64_STRDpre:
			case AArch64_STRHHpost:
			case AArch64_STRHHpre:
			case AArch64_STRHpost:
			case AArch64_STRHpre:
			case AArch64_STRQpost:
			case AArch64_STRQpre:
			case AArch64_STRSpost:
			case AArch64_STRSpre:
			case AArch64_STRWpost:
			case AArch64_STRWpre:
			case AArch64_STRXpost:
			case AArch64_STRXpre:
				flat_insn->detail->arm64.writeback = true;
				break;
		}
	}
}